

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O2

void __thiscall
llbuild::buildsystem::BuildSystemDelegate::~BuildSystemDelegate(BuildSystemDelegate *this)

{
  this->_vptr_BuildSystemDelegate = (_func_int **)&PTR__BuildSystemDelegate_0023c408;
  std::__cxx11::string::_M_dispose();
  return;
}

Assistant:

BuildSystemDelegate::~BuildSystemDelegate() {}